

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O3

Float __thiscall pbrt::TabulatedBSSRDF::PDF_Sp(TabulatedBSSRDF *this,Point3f *pi,Normal3f *ni)

{
  float fVar1;
  Float r;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  int ch;
  int ch_00;
  int axis;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Float FVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined8 local_30;
  undefined4 local_28;
  
  auVar26._8_4_ = 0x3f800000;
  auVar26._0_8_ = 0x3f8000003f800000;
  auVar26._12_4_ = 0x3f800000;
  auVar27._8_4_ = 0x80000000;
  auVar27._0_8_ = 0x8000000080000000;
  auVar27._12_4_ = 0x80000000;
  fVar5 = (this->ns).super_Tuple3<pbrt::Normal3,_float>.z;
  uVar3._0_4_ = (this->ns).super_Tuple3<pbrt::Normal3,_float>.x;
  uVar3._4_4_ = (this->ns).super_Tuple3<pbrt::Normal3,_float>.y;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar3;
  fVar1 = (ni->super_Tuple3<pbrt::Normal3,_float>).z;
  lVar12 = 0;
  fVar8 = (pi->super_Tuple3<pbrt::Point3,_float>).y - (this->po).super_Tuple3<pbrt::Point3,_float>.y
  ;
  fVar9 = (pi->super_Tuple3<pbrt::Point3,_float>).x - (this->po).super_Tuple3<pbrt::Point3,_float>.x
  ;
  fVar10 = (pi->super_Tuple3<pbrt::Point3,_float>).z -
           (this->po).super_Tuple3<pbrt::Point3,_float>.z;
  auVar19 = vmovshdup_avx(auVar24);
  auVar13 = vpternlogd_avx512vl(auVar26,ZEXT416((uint)fVar5),auVar27,0xf8);
  fVar25 = auVar19._0_4_;
  fVar29 = auVar13._0_4_;
  auVar28._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
  auVar28._8_4_ = auVar19._8_4_ ^ 0x80000000;
  auVar28._12_4_ = auVar19._12_4_ ^ 0x80000000;
  fVar6 = -fVar29 * (float)(undefined4)uVar3;
  fVar30 = -1.0 / (fVar29 + fVar5);
  auVar14 = vmulss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar1));
  fVar7 = (float)(undefined4)uVar3 * fVar25 * fVar30;
  auVar26 = vfmadd213ss_fma(ZEXT416((uint)(fVar29 * (float)(undefined4)uVar3 *
                                          (float)(undefined4)uVar3)),ZEXT416((uint)fVar30),auVar26);
  auVar27 = vfmadd213ss_fma(ZEXT416((uint)(fVar25 * fVar25)),ZEXT416((uint)fVar30),auVar13);
  uVar2 = (ni->super_Tuple3<pbrt::Normal3,_float>).x;
  uVar4 = (ni->super_Tuple3<pbrt::Normal3,_float>).y;
  auVar31._4_4_ = uVar4;
  auVar31._0_4_ = uVar2;
  auVar31._8_8_ = 0;
  auVar16._4_4_ = fVar8;
  auVar16._0_4_ = fVar8;
  auVar16._8_4_ = fVar8;
  auVar16._12_4_ = fVar8;
  auVar13 = vinsertps_avx512f(auVar27,ZEXT416((uint)(fVar29 * fVar7)),0x10);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar25)),ZEXT416((uint)fVar9),auVar24);
  auVar23._4_4_ = fVar9;
  auVar23._0_4_ = fVar9;
  auVar23._8_4_ = fVar9;
  auVar23._12_4_ = fVar9;
  auVar15 = vmulps_avx512vl(auVar16,auVar13);
  auVar13 = vmovshdup_avx(auVar31);
  auVar16 = vfmadd213ss_avx512f(ZEXT416((uint)(fVar29 * fVar7)),auVar13,auVar14);
  auVar17 = vfmsub231ss_avx512f(auVar14,ZEXT416((uint)fVar1),ZEXT416((uint)fVar6));
  auVar14 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar10),ZEXT416((uint)fVar5));
  auVar21._4_4_ = fVar10;
  auVar21._0_4_ = fVar10;
  auVar21._8_4_ = fVar10;
  auVar21._12_4_ = fVar10;
  auVar18 = vaddss_avx512f(auVar17,auVar16);
  auVar16 = vfmadd231ss_fma(auVar18,auVar31,auVar26);
  auVar27 = vfmadd213ss_fma(auVar27,auVar13,ZEXT416((uint)(fVar1 * -fVar25)));
  auVar11 = vfnmsub231ss_fma(ZEXT416((uint)(fVar1 * -fVar25)),ZEXT416((uint)fVar1),auVar19);
  auVar18 = vfmadd213ss_fma(auVar19,auVar13,ZEXT416((uint)(fVar1 * fVar5)));
  auVar17 = vfmsub213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 * fVar5))
                           );
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ + auVar11._0_4_)),auVar31,
                            ZEXT416((uint)fVar7));
  auVar19 = vinsertps_avx(ZEXT416((uint)fVar7),auVar26,0x10);
  auVar13 = vfmadd213ps_fma(auVar19,auVar23,auVar15);
  auVar19 = vinsertps_avx(auVar28,ZEXT416((uint)fVar6),0x1c);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ + auVar17._0_4_)),auVar31,auVar24);
  fVar1 = auVar14._0_4_ * auVar14._0_4_;
  auVar19 = vfmadd213ps_fma(auVar19,auVar21,auVar13);
  auVar13._0_4_ = auVar19._0_4_ * auVar19._0_4_;
  auVar13._4_4_ = auVar19._4_4_ * auVar19._4_4_;
  auVar13._8_4_ = auVar19._8_4_ * auVar19._8_4_;
  auVar13._12_4_ = auVar19._12_4_ * auVar19._12_4_;
  auVar18._0_4_ = fVar1 + auVar13._0_4_;
  auVar18._4_4_ = fVar1 + auVar13._4_4_;
  auVar18._8_4_ = fVar1 + auVar13._8_4_;
  auVar18._12_4_ = fVar1 + auVar13._12_4_;
  auVar19 = vhaddps_avx(auVar13,auVar13);
  auVar13 = vsqrtps_avx(auVar18);
  auVar19 = vsqrtss_avx(auVar19,auVar19);
  local_30 = vmovlps_avx(auVar13);
  local_28 = auVar19._0_4_;
  auVar22 = ZEXT864(0) << 0x20;
  do {
    r = *(Float *)((long)&local_30 + lVar12 * 4);
    ch_00 = 0;
    do {
      FVar20 = PDF_Sr(this,ch_00,r);
      auVar19 = ZEXT416(auVar16._0_4_);
      if (((int)lVar12 != 0) && (auVar19 = ZEXT416(auVar27._0_4_), (int)lVar12 != 1)) {
        auVar19 = ZEXT416(auVar26._0_4_);
      }
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx512vl(auVar19,auVar14);
      ch_00 = ch_00 + 1;
      auVar19 = vfmadd231ss_fma(ZEXT416(auVar22._0_4_),
                                ZEXT416((uint)(FVar20 * auVar19._0_4_ * 0.25)),
                                ZEXT416((uint)(&DAT_0056de14)[lVar12]));
      auVar22 = ZEXT1664(auVar19);
    } while (ch_00 != 4);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  return auVar19._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF_Sp(const Point3f &pi, const Normal3f &ni) const {
        // Express $\pti-\pto$ and $\bold{n}_i$ with respect to local coordinates at
        // $\pto$
        Vector3f d = pi - po;
        Frame f = Frame::FromZ(ns);
        Vector3f dLocal = f.ToLocal(d);
        Normal3f nLocal = f.ToLocal(ni);

        // Compute BSSRDF profile radius under projection along each axis
        Float rProj[3] = {std::sqrt(Sqr(dLocal.y) + Sqr(dLocal.z)),
                          std::sqrt(Sqr(dLocal.z) + Sqr(dLocal.x)),
                          std::sqrt(Sqr(dLocal.x) + Sqr(dLocal.y))};

        // Return combined probability from all BSSRDF sampling strategies
        Float pdf = 0, axisProb[3] = {.25f, .25f, .5f};
        Float chProb = 1 / (Float)NSpectrumSamples;
        for (int axis = 0; axis < 3; ++axis)
            for (int ch = 0; ch < NSpectrumSamples; ++ch)
                pdf += PDF_Sr(ch, rProj[axis]) * std::abs(nLocal[axis]) * chProb *
                       axisProb[axis];
        return pdf;
    }